

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void QItemSelection::split
               (QItemSelectionRange *range,QItemSelectionRange *other,QItemSelection *result)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  QAbstractItemModel *pQVar8;
  QAbstractItemModel *pQVar9;
  QItemSelectionRange *in_RDX;
  long in_FS_OFFSET;
  bool bVar10;
  QAbstractItemModel *model;
  int other_right;
  int other_bottom;
  int other_left;
  int other_top;
  int right;
  int bottom;
  int left;
  int top;
  QModelIndex br_3;
  QModelIndex tl_3;
  QModelIndex br_2;
  QModelIndex tl_2;
  QModelIndex br_1;
  QModelIndex tl_1;
  QModelIndex br;
  QModelIndex tl;
  QModelIndex parent;
  QModelIndex *in_stack_fffffffffffffd58;
  QModelIndex *in_stack_fffffffffffffd60;
  QItemSelectionRange *this;
  QModelIndex *in_stack_fffffffffffffd70;
  QModelIndex *bottomR;
  QModelIndex *in_stack_fffffffffffffd78;
  QModelIndex *topL;
  QItemSelectionRange *in_stack_fffffffffffffd80;
  uint local_1ac;
  uint local_1a4;
  QModelIndex local_178;
  QModelIndex local_158 [2];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 *local_118;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 *local_f8;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 *local_c8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 *local_a8;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffffd60);
  QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffffd60);
  bVar1 = ::operator!=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  bVar10 = true;
  if (!bVar1) {
    pQVar8 = QItemSelectionRange::model((QItemSelectionRange *)0x825c40);
    pQVar9 = QItemSelectionRange::model((QItemSelectionRange *)0x825c55);
    bVar10 = pQVar8 != pQVar9;
  }
  if (!bVar10) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffffd60);
    local_1a4 = QItemSelectionRange::top((QItemSelectionRange *)0x825cce);
    uVar2 = QItemSelectionRange::left((QItemSelectionRange *)0x825ce2);
    local_1ac = QItemSelectionRange::bottom((QItemSelectionRange *)0x825cf6);
    uVar3 = QItemSelectionRange::right((QItemSelectionRange *)0x825d0a);
    uVar4 = QItemSelectionRange::top((QItemSelectionRange *)0x825d1e);
    iVar5 = QItemSelectionRange::left((QItemSelectionRange *)0x825d32);
    uVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x825d46);
    iVar7 = QItemSelectionRange::right((QItemSelectionRange *)0x825d5a);
    pQVar8 = QItemSelectionRange::model((QItemSelectionRange *)0x825d6e);
    if ((int)local_1a4 < (int)uVar4) {
      local_68 = 0xaaaaaaaa;
      uStack_64 = 0xaaaaaaaa;
      uStack_60 = 0xaaaaaaaa;
      uStack_5c = 0xaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])(&local_68,pQVar8,(ulong)local_1a4,(ulong)uVar2);
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = 0xaaaaaaaa;
      uStack_84 = 0xaaaaaaaa;
      uStack_80 = 0xaaaaaaaa;
      uStack_7c = 0xaaaaaaaa;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                (&local_88,pQVar8,(ulong)(uVar4 - 1),(ulong)uVar3,&local_50);
      QItemSelectionRange::QItemSelectionRange
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd60,
                 (rvalue_ref)in_stack_fffffffffffffd58);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffd60);
      local_1a4 = uVar4;
    }
    if ((int)uVar6 < (int)local_1ac) {
      local_b8 = 0xaaaaaaaa;
      uStack_b4 = 0xaaaaaaaa;
      uStack_b0 = 0xaaaaaaaa;
      uStack_ac = 0xaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                (&local_b8,pQVar8,(ulong)(uVar6 + 1),(ulong)uVar2);
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = 0xaaaaaaaa;
      uStack_d4 = 0xaaaaaaaa;
      uStack_d0 = 0xaaaaaaaa;
      uStack_cc = 0xaaaaaaaa;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                (&local_d8,pQVar8,(ulong)local_1ac,(ulong)uVar3,&local_50);
      QItemSelectionRange::QItemSelectionRange
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd60,
                 (rvalue_ref)in_stack_fffffffffffffd58);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffd60);
      local_1ac = uVar6;
    }
    if ((int)uVar2 < iVar5) {
      local_108 = 0xaaaaaaaa;
      uStack_104 = 0xaaaaaaaa;
      uStack_100 = 0xaaaaaaaa;
      uStack_fc = 0xaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])(&local_108,pQVar8,(ulong)local_1a4,(ulong)uVar2)
      ;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = 0xaaaaaaaa;
      uStack_124 = 0xaaaaaaaa;
      uStack_120 = 0xaaaaaaaa;
      uStack_11c = 0xaaaaaaaa;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                (&local_128,pQVar8,(ulong)local_1ac,(ulong)(iVar5 - 1),&local_50);
      QItemSelectionRange::QItemSelectionRange
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd60,
                 (rvalue_ref)in_stack_fffffffffffffd58);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffd60);
    }
    if (iVar7 < (int)uVar3) {
      local_158[0].r = -0x55555556;
      local_158[0].c = -0x55555556;
      local_158[0].i._0_4_ = 0xaaaaaaaa;
      local_158[0].i._4_4_ = 0xaaaaaaaa;
      this = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_158[0].m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      bottomR = local_158;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                (bottomR,pQVar8,(ulong)local_1a4,(ulong)(iVar7 + 1));
      local_178.r = -0x55555556;
      local_178.c = -0x55555556;
      local_178.i._0_4_ = 0xaaaaaaaa;
      local_178.i._4_4_ = 0xaaaaaaaa;
      topL = &local_178;
      local_178.m.ptr = (QAbstractItemModel *)this;
      (*(pQVar8->super_QObject)._vptr_QObject[0xc])
                (topL,pQVar8,(ulong)local_1ac,(ulong)uVar3,&local_50);
      QItemSelectionRange::QItemSelectionRange(in_RDX,topL,bottomR);
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)this,(rvalue_ref)in_stack_fffffffffffffd58);
      QItemSelectionRange::~QItemSelectionRange(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelection::split(const QItemSelectionRange &range,
                           const QItemSelectionRange &other, QItemSelection *result)
{
    if (range.parent() != other.parent() || range.model() != other.model())
        return;

    QModelIndex parent = other.parent();
    int top = range.top();
    int left = range.left();
    int bottom = range.bottom();
    int right = range.right();
    int other_top = other.top();
    int other_left = other.left();
    int other_bottom = other.bottom();
    int other_right = other.right();
    const QAbstractItemModel *model = range.model();
    Q_ASSERT(model);
    if (other_top > top) {
        QModelIndex tl = model->index(top, left, parent);
        QModelIndex br = model->index(other_top - 1, right, parent);
        result->append(QItemSelectionRange(tl, br));
        top = other_top;
    }
    if (other_bottom < bottom) {
        QModelIndex tl = model->index(other_bottom + 1, left, parent);
        QModelIndex br = model->index(bottom, right, parent);
        result->append(QItemSelectionRange(tl, br));
        bottom = other_bottom;
    }
    if (other_left > left) {
        QModelIndex tl = model->index(top, left, parent);
        QModelIndex br = model->index(bottom, other_left - 1, parent);
        result->append(QItemSelectionRange(tl, br));
        left = other_left;
    }
    if (other_right < right) {
        QModelIndex tl = model->index(top, other_right + 1, parent);
        QModelIndex br = model->index(bottom, right, parent);
        result->append(QItemSelectionRange(tl, br));
        right = other_right;
    }
}